

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterval.cpp
# Opt level: O0

void anon_unknown.dwarf_5b268::testMakeInfinite<double>(char *type)

{
  bool bVar1;
  ostream *poVar2;
  char *in_RDI;
  double dVar3;
  Interval<double> b_2;
  double max;
  double min;
  Interval<double> b_1;
  Interval<double> b;
  Interval<double> *in_stack_ffffffffffffff60;
  Interval<double> local_58;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  Interval<double> local_28;
  double local_18;
  double local_10;
  char *local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"    makeInfinite() for type ");
  poVar2 = std::operator<<(poVar2,local_8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Interval<double>::Interval((Interval<double> *)0x16bd7e);
  Imath_3_2::Interval<double>::makeInfinite(in_stack_ffffffffffffff60);
  dVar3 = std::numeric_limits<double>::lowest();
  bVar1 = false;
  if ((local_18 == dVar3) && (!NAN(local_18) && !NAN(dVar3))) {
    dVar3 = std::numeric_limits<double>::max();
    bVar1 = local_10 == dVar3;
  }
  if (!bVar1) {
    __assert_fail("b.min == T (std::numeric_limits<T>::lowest ()) && b.max == T (std::numeric_limits<T>::max ())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x7f,"void (anonymous namespace)::testMakeInfinite(const char *) [T = double]");
  }
  local_30 = -1.0;
  local_38 = 1.0;
  Imath_3_2::Interval<double>::Interval(&local_28,&local_30,&local_38);
  Imath_3_2::Interval<double>::makeInfinite(in_stack_ffffffffffffff60);
  dVar3 = std::numeric_limits<double>::lowest();
  bVar1 = false;
  if ((local_28.min == dVar3) && (!NAN(local_28.min) && !NAN(dVar3))) {
    dVar3 = std::numeric_limits<double>::max();
    bVar1 = local_28.max == dVar3;
  }
  if (!bVar1) {
    __assert_fail("b.min == T (std::numeric_limits<T>::lowest ()) && b.max == T (std::numeric_limits<T>::max ())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x8a,"void (anonymous namespace)::testMakeInfinite(const char *) [T = double]");
  }
  local_40 = 0.0;
  local_48 = 1.0;
  Imath_3_2::Interval<double>::Interval(&local_58,&local_40,&local_48);
  Imath_3_2::Interval<double>::makeInfinite(in_stack_ffffffffffffff60);
  dVar3 = std::numeric_limits<double>::lowest();
  bVar1 = false;
  if ((local_58.min == dVar3) && (!NAN(local_58.min) && !NAN(dVar3))) {
    dVar3 = std::numeric_limits<double>::max();
    bVar1 = local_58.max == dVar3;
  }
  if (!bVar1) {
    __assert_fail("b.min == T (std::numeric_limits<T>::lowest ()) && b.max == T (std::numeric_limits<T>::max ())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x98,"void (anonymous namespace)::testMakeInfinite(const char *) [T = double]");
  }
  return;
}

Assistant:

void
testMakeInfinite (const char* type)
{
    cout << "    makeInfinite() for type " << type << endl;

    //
    // Infinite interval
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;
        b.makeInfinite ();
        assert (
            b.min == T (std::numeric_limits<T>::lowest ()) &&
            b.max == T (std::numeric_limits<T>::max ()));
    }

    //
    // Non-empty, has volume
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b (T (-1), T (1));
        b.makeInfinite ();
        assert (
            b.min == T (std::numeric_limits<T>::lowest ()) &&
            b.max == T (std::numeric_limits<T>::max ()));
    }

    //
    // Non-empty, no volume
    //
    {
        T min (0);
        T max (1);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b (min, max);
        b.makeInfinite ();
        assert (
            b.min == T (std::numeric_limits<T>::lowest ()) &&
            b.max == T (std::numeric_limits<T>::max ()));
    }
}